

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O0

size_t __thiscall
hrvo::Simulator::addAgent
          (Simulator *this,Vector2 *position,size_t goalNo,float neighborDist,size_t maxNeighbors,
          float radius,float goalRadius,float prefSpeed,float maxSpeed,float uncertaintyOffset,
          float maxAccel,Vector2 *velocity,float orientation)

{
  size_type sVar1;
  size_t in_RCX;
  size_t in_RDX;
  Vector2 *in_RSI;
  Simulator *in_RDI;
  undefined8 in_R8;
  float in_XMM0_Da;
  float in_XMM1_Da;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float in_XMM7_Da;
  Agent *unaff_retaddr;
  Agent *agent;
  value_type *in_stack_ffffffffffffff98;
  vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_> *in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffb0;
  Simulator *simulator;
  
  simulator = in_RDI;
  operator_new(0xd8);
  Agent::Agent(unaff_retaddr,simulator,in_RSI,in_RDX,in_XMM0_Da,in_RCX,in_XMM1_Da,
               (Vector2 *)CONCAT44(in_XMM3_Da,in_XMM4_Da),in_XMM5_Da,in_XMM6_Da,
               (float)((ulong)in_R8 >> 0x20),(float)in_R8,in_XMM7_Da,in_stack_ffffffffffffffb0);
  std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::push_back
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  sVar1 = std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::size(&in_RDI->agents_);
  return sVar1 - 1;
}

Assistant:

std::size_t Simulator::addAgent(const Vector2 &position, std::size_t goalNo,
                                float neighborDist, std::size_t maxNeighbors,
                                float radius, float goalRadius, float prefSpeed,
                                float maxSpeed,
#if HRVO_DIFFERENTIAL_DRIVE
                                float timeToOrientation, float wheelTrack,
#endif /* HRVO_DIFFERENTIAL_DRIVE */
                                float uncertaintyOffset, float maxAccel,
                                const Vector2 &velocity, float orientation) {
  Agent *const agent = new Agent(this, position, goalNo, neighborDist,
                                 maxNeighbors, radius, velocity, maxAccel,
                                 goalRadius, prefSpeed, maxSpeed, orientation,
#if HRVO_DIFFERENTIAL_DRIVE
                                 timeToOrientation, wheelTrack,
#endif /* HRVO_DIFFERENTIAL_DRIVE */
                                 uncertaintyOffset);
  agents_.push_back(agent);

  return agents_.size() - 1U;
}